

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCall.cpp
# Opt level: O1

string * __thiscall
ninx::parser::element::FunctionCall::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionCall *this,int level)

{
  pointer puVar1;
  FunctionCallArgument *pFVar2;
  string *psVar3;
  FunctionCall *pFVar4;
  long *plVar5;
  ostream *poVar6;
  long *plVar7;
  int iVar8;
  pointer puVar9;
  stringstream s;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218 [2];
  long local_208 [2];
  ulong local_1f8;
  long local_1f0;
  string *local_1e8;
  FunctionCall *local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct((ulong)local_218,(char)level);
  local_1e8 = __return_storage_ptr__;
  plVar5 = (long *)std::__cxx11::string::append((char *)local_218);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_228 = *plVar7;
    lStack_220 = plVar5[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar7;
    local_238 = (long *)*plVar5;
  }
  local_230 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_238,local_230)
  ;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," {",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  if (this->late_call == true) {
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct((ulong)local_218,(char)level + '\x01');
    plVar5 = (long *)std::__cxx11::string::append((char *)local_218);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_228 = *plVar7;
      lStack_220 = plVar5[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar7;
      local_238 = (long *)*plVar5;
    }
    local_230 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_238,local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_218[0] != local_208) {
      operator_delete(local_218[0],local_208[0] + 1);
    }
  }
  puVar9 = (this->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1f8 = (ulong)(uint)level;
  local_1f0 = (long)level;
  local_1e0 = this;
  if (puVar9 != puVar1) {
    do {
      pFVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
               ._M_t.
               super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
               .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
               _M_head_impl;
      (**(code **)((long)(pFVar2->super_ASTElement)._vptr_ASTElement + 0x18))
                (&local_238,pFVar2,level + 1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_238,local_230);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (local_238 != &local_228) {
        operator_delete(local_238,local_228 + 1);
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar1);
  }
  pFVar4 = local_1e0;
  if ((local_1e0->outer_argument)._M_t.
      super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl !=
      (FunctionCallArgument *)0x0) {
    iVar8 = (int)local_1f8 + 1;
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct((ulong)local_218,(char)iVar8);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_218);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_228 = *plVar7;
      lStack_220 = plVar5[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar7;
      local_238 = (long *)*plVar5;
    }
    local_230 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_238,local_230);
    pFVar2 = (pFVar4->outer_argument)._M_t.
             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
             _M_head_impl;
    (**(code **)((long)(pFVar2->super_ASTElement)._vptr_ASTElement + 0x18))(&local_1d8,pFVar2,iVar8)
    ;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1d8,local_1d0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_218[0] != local_208) {
      operator_delete(local_218[0],local_208[0] + 1);
    }
  }
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct((ulong)local_218,(char)local_1f0);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_218);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_228 = *plVar7;
    lStack_220 = plVar5[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar7;
    local_238 = (long *)*plVar5;
  }
  local_230 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_238,local_230)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  psVar3 = local_1e8;
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string ninx::parser::element::FunctionCall::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "FunctionCall " << this->name << " {" << std::endl;
    if (this->late_call){
        s << std::string(level+1, '\t') + "LATE CALL" << std::endl;
    }
    for (auto& argument : arguments) {
        s << argument->dump(level+1) << std::endl;
    }
    if (this->outer_argument) {
        s << std::string(level+1, '\t') + "OuterArgument-> " << this->outer_argument->dump(level+1) << std::endl;
    }
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}